

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_BasicBehavior_deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures_Test
::
TEST_BasicBehavior_deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures_Test
          (TEST_BasicBehavior_deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures_Test
           *this)

{
  TEST_BasicBehavior_deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures_Test
  *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupBasicBehavior::TEST_GROUP_CppUTestGroupBasicBehavior
            (&this->super_TEST_GROUP_CppUTestGroupBasicBehavior);
  (this->super_TEST_GROUP_CppUTestGroupBasicBehavior).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_BasicBehavior_deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures_Test_00401270
  ;
  return;
}

Assistant:

TEST(BasicBehavior, deleteWillNotThrowAnExceptionWhenDeletingUnallocatedMemoryButCanStillCauseTestFailures)
{
    /*
     * Test failure might cause an exception. But according to C++ standard, you aren't allowed
     * to throw exceptions in the delete function. If you do that, it will call std::terminate.
     * Therefore, the delete will need to fail without exceptions.
     */
    MemoryLeakFailure* defaultReporter = MemoryLeakWarningPlugin::getGlobalFailureReporter();
    TestTestingFixture fixture;
    fixture.setTestFunction(deleteUnallocatedMemory);
    fixture.runAllTests();
    LONGS_EQUAL(1, fixture.getFailureCount());
    POINTERS_EQUAL(defaultReporter, MemoryLeakWarningPlugin::getGlobalFailureReporter());
}